

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

void on_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *rdbuf)

{
  int iVar1;
  uv_buf_t uVar2;
  char *local_50;
  char *local_48;
  undefined1 auStack_38 [4];
  int r;
  uv_buf_t wrbuf;
  uv_write_t *req;
  uv_buf_t *rdbuf_local;
  ssize_t nread_local;
  uv_stream_t *tcp_local;
  
  if ((nread < 1) && (nread != -0xfff)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x66,"nread > 0 || nread == UV_EOF");
    abort();
  }
  if ((0 < nread) && (output_used = output_used + (int)nread, output_used == 0xc)) {
    iVar1 = memcmp("hello world\n",output,0xc);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
              ,0x6b,"memcmp(\"hello world\\n\", output, 12) == 0");
      abort();
    }
    uVar2 = uv_buf_init(output,output_used);
    local_50 = uVar2.base;
    _auStack_38 = local_50;
    local_48 = (char *)uVar2.len;
    wrbuf.base = local_48;
    wrbuf.len = (size_t)malloc(0xc0);
    iVar1 = uv_write((uv_write_t *)wrbuf.len,(uv_stream_t *)&in,(uv_buf_t *)auStack_38,1,after_write
                    );
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
              ,0x6f,"r == 0");
      abort();
    }
  }
  on_read_cb_called = on_read_cb_called + 1;
  return;
}

Assistant:

static void on_read(uv_stream_t* handle,
                    ssize_t nread,
                    const uv_buf_t* buf) {
  int r;
  uv_pipe_t* pipe;
  uv_handle_type pending;
  uv_buf_t outbuf;

  pipe = (uv_pipe_t*) handle;

  if (nread == 0) {
    /* Everything OK, but nothing read. */
    free(buf->base);
    return;
  }

  if (nread < 0) {
    if (nread == UV_EOF) {
      free(buf->base);
      return;
    }

    printf("error recving on channel: %s\n", uv_strerror(nread));
    abort();
  }

  fprintf(stderr, "got %d bytes\n", (int)nread);

  pending = uv_pipe_pending_type(pipe);
  if (!tcp_server_listening) {
    ASSERT(1 == uv_pipe_pending_count(pipe));
    ASSERT(nread > 0 && buf->base && pending != UV_UNKNOWN_HANDLE);
    read_cb_called++;

    /* Accept the pending TCP server, and start listening on it. */
    ASSERT(pending == UV_TCP);
    r = uv_tcp_init(uv_default_loop(), &tcp_server);
    ASSERT(r == 0);

    r = uv_accept((uv_stream_t*)pipe, (uv_stream_t*)&tcp_server);
    ASSERT(r == 0);

    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, on_connection);
    ASSERT(r == 0);

    tcp_server_listening = 1;

    /* Make sure that the expected data is correctly multiplexed. */
    ASSERT(memcmp("hello\n", buf->base, nread) == 0);

    outbuf = uv_buf_init("world\n", 6);
    r = uv_write(&write_req, (uv_stream_t*)pipe, &outbuf, 1, NULL);
    ASSERT(r == 0);

    /* Create a bunch of connections to get both servers to accept. */
    make_many_connections();
  } else if (memcmp("accepted_connection\n", buf->base, nread) == 0) {
    /* Remote server has accepted a connection.  Close the channel. */
    ASSERT(0 == uv_pipe_pending_count(pipe));
    ASSERT(pending == UV_UNKNOWN_HANDLE);
    remote_conn_accepted = 1;
    uv_close((uv_handle_t*)&channel, NULL);
  }

  free(buf->base);
}